

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::OptConstPeep(GlobOpt *this,Instr *instr,Opnd *constSrc,Value **pDstVal,ValueInfo *valuInfo)

{
  short sVar1;
  code *pcVar2;
  Value **ppVVar3;
  bool bVar4;
  Opnd *pOVar5;
  AddrOpnd *pAVar6;
  IntConstOpnd *this_00;
  Opnd *pOVar7;
  undefined4 *puVar8;
  Opnd *pOVar9;
  AddrOpnd *local_78;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  AddrOpnd *local_58;
  AddrOpnd *addrOpnd;
  Opnd *nonConstSrc;
  Opnd *src;
  ValueInfo *pVStack_38;
  int32 value;
  ValueInfo *valuInfo_local;
  Value **pDstVal_local;
  Opnd *constSrc_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pVStack_38 = valuInfo;
  valuInfo_local = (ValueInfo *)pDstVal;
  pDstVal_local = (Value **)constSrc;
  constSrc_local = (Opnd *)instr;
  instr_local = (Instr *)this;
  pOVar5 = IR::Instr::GetSrc1(instr);
  if (constSrc == pOVar5) {
    local_78 = (AddrOpnd *)IR::Instr::GetSrc2((Instr *)constSrc_local);
  }
  else {
    local_78 = (AddrOpnd *)IR::Instr::GetSrc1((Instr *)constSrc_local);
  }
  addrOpnd = local_78;
  bVar4 = ValueInfo::TryGetIntConstantValue(pVStack_38,(int32 *)((long)&src + 4),false);
  if (!bVar4) {
    bVar4 = IR::Opnd::IsAddrOpnd((Opnd *)pDstVal_local);
    if (bVar4) {
      local_58 = IR::Opnd::AsAddrOpnd((Opnd *)pDstVal_local);
      bVar4 = IR::AddrOpnd::IsVar(local_58);
      if ((!bVar4) && (bVar4 = Math::FitsInDWord((size_t)local_58->m_address), !bVar4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x195b,
                           "(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address))",
                           "addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address)");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      bVar4 = IR::AddrOpnd::IsVar(local_58);
      if (bVar4) {
        src._4_4_ = Js::TaggedInt::ToInt32(local_58->m_address);
      }
      else {
        pAVar6 = IR::Opnd::AsAddrOpnd((Opnd *)pDstVal_local);
        src._4_4_ = Math::PointerCastToIntegral<int>(pAVar6->m_address);
      }
    }
    else {
      bVar4 = IR::Opnd::IsIntConstOpnd((Opnd *)pDstVal_local);
      if (!bVar4) {
        return false;
      }
      this_00 = IR::Opnd::AsIntConstOpnd((Opnd *)pDstVal_local);
      src._4_4_ = IR::IntConstOpnd::AsInt32(this_00);
    }
  }
  ppVVar3 = pDstVal_local;
  sVar1 = *(short *)&constSrc_local[3]._vptr_Opnd;
  if (sVar1 == 0x2d) {
    nonConstSrc = &addrOpnd->super_Opnd;
    local_5a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&addrOpnd->super_Opnd);
    bVar4 = ValueType::IsInt((ValueType *)&local_5a.field_0);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      return false;
    }
LAB_0059bb6a:
    ppVVar3 = pDstVal_local;
    if (src._4_4_ != 0) {
      return false;
    }
    pOVar5 = IR::Instr::GetSrc1((Instr *)constSrc_local);
    if ((Opnd *)ppVVar3 == pOVar5) {
      nonConstSrc = IR::Instr::GetSrc2((Instr *)constSrc_local);
    }
    else {
      nonConstSrc = IR::Instr::GetSrc1((Instr *)constSrc_local);
    }
  }
  else {
    if (sVar1 == 0x2e) {
      if ((src._4_4_ != 1) ||
         (pOVar5 = IR::Instr::GetSrc2((Instr *)constSrc_local), (Opnd *)ppVVar3 != pOVar5)) {
        return false;
      }
      nonConstSrc = IR::Instr::GetSrc1((Instr *)constSrc_local);
      goto LAB_0059bcd0;
    }
    if (sVar1 != 0x30) {
      if (sVar1 == 0x1c0) goto LAB_0059bb6a;
      if (sVar1 != 0x1c2) {
        if (sVar1 == 0x1c7) {
          if (src._4_4_ == -1) {
            nonConstSrc = &addrOpnd->super_Opnd;
          }
          else {
            if (src._4_4_ != 0) {
              return false;
            }
            nonConstSrc = (Opnd *)pDstVal_local;
          }
        }
        else if (sVar1 == 0x1c8) {
          if (src._4_4_ == -1) {
            nonConstSrc = (Opnd *)pDstVal_local;
          }
          else {
            if (src._4_4_ != 0) {
              return false;
            }
            nonConstSrc = &addrOpnd->super_Opnd;
          }
        }
        else {
          if (2 < (ushort)(sVar1 - 0x1caU)) {
            return false;
          }
          if ((src._4_4_ != 0) ||
             (pOVar5 = IR::Instr::GetSrc2((Instr *)constSrc_local), (Opnd *)ppVVar3 != pOVar5)) {
            return false;
          }
          nonConstSrc = IR::Instr::GetSrc1((Instr *)constSrc_local);
        }
        goto LAB_0059bcd0;
      }
    }
    if (src._4_4_ == 0) {
      return false;
    }
    if (src._4_4_ != 1) {
      return false;
    }
    nonConstSrc = &addrOpnd->super_Opnd;
  }
LAB_0059bcd0:
  CaptureByteCodeSymUses(this,(Instr *)constSrc_local);
  pOVar5 = nonConstSrc;
  pOVar7 = IR::Instr::GetSrc1((Instr *)constSrc_local);
  pOVar9 = nonConstSrc;
  if (pOVar5 == pOVar7) {
    IR::Instr::FreeSrc2((Instr *)constSrc_local);
  }
  else {
    pOVar5 = IR::Instr::GetSrc2((Instr *)constSrc_local);
    if (pOVar9 != pOVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x19e1,"(src == instr->GetSrc2())","src == instr->GetSrc2()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pOVar5 = constSrc_local;
    pOVar9 = IR::Instr::UnlinkSrc2((Instr *)constSrc_local);
    IR::Instr::ReplaceSrc1((Instr *)pOVar5,pOVar9);
  }
  *(undefined2 *)&constSrc_local[3]._vptr_Opnd = 0x45;
  InvalidateInductionVariables(this,(Instr *)constSrc_local);
  return true;
}

Assistant:

bool
GlobOpt::OptConstPeep(IR::Instr *instr, IR::Opnd *constSrc, Value **pDstVal, ValueInfo *valuInfo)
{
    int32 value;
    IR::Opnd *src;
    IR::Opnd *nonConstSrc = (constSrc == instr->GetSrc1() ? instr->GetSrc2() : instr->GetSrc1());

    // Try to find the value from value info first
    if (valuInfo->TryGetIntConstantValue(&value))
    {
    }
    else if (constSrc->IsAddrOpnd())
    {
        IR::AddrOpnd *addrOpnd = constSrc->AsAddrOpnd();
#ifdef _M_X64
        Assert(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address));
#else
        Assert(sizeof(value) == sizeof(addrOpnd->m_address));
#endif

        if (addrOpnd->IsVar())
        {
            value = Js::TaggedInt::ToInt32(addrOpnd->m_address);
        }
        else
        {
            // We asserted that the address will fit in a DWORD above
            value = ::Math::PointerCastToIntegral<int32>(constSrc->AsAddrOpnd()->m_address);
        }
    }
    else if (constSrc->IsIntConstOpnd())
    {
        value = constSrc->AsIntConstOpnd()->AsInt32();
    }
    else
    {
        return false;
    }

    switch(instr->m_opcode)
    {
        // Can't do all Add_A because of string concats.
        // Sub_A cannot be transformed to a NEG_A because 0 - 0 != -0
    case Js::OpCode::Add_A:
        src = nonConstSrc;

        if (!src->GetValueType().IsInt())
        {
            // 0 + -0  != -0
            // "Foo" + 0 != "Foo
            return false;
        }
        // fall-through

    case Js::OpCode::Add_I4:
        if (value != 0)
        {
            return false;
        }
        if (constSrc == instr->GetSrc1())
        {
            src = instr->GetSrc2();
        }
        else
        {
            src = instr->GetSrc1();
        }
        break;

    case Js::OpCode::Mul_A:
    case Js::OpCode::Mul_I4:
        if (value == 0)
        {
            // -0 * 0 != 0
            return false;
        }
        else if (value == 1)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Div_A:
        if (value == 1 && constSrc == instr->GetSrc2())
        {
            src = instr->GetSrc1();
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Or_I4:
        if (value == -1)
        {
            src = constSrc;
        }
        else if (value == 0)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::And_I4:
        if (value == -1)
        {
            src = nonConstSrc;
        }
        else if (value == 0)
        {
            src = constSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Shl_I4:
    case Js::OpCode::ShrU_I4:
    case Js::OpCode::Shr_I4:
        if (value != 0 || constSrc != instr->GetSrc2())
        {
            return false;
        }
        src = instr->GetSrc1();
        break;

    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    if (src == instr->GetSrc1())
    {
        instr->FreeSrc2();
    }
    else
    {
        Assert(src == instr->GetSrc2());
        instr->ReplaceSrc1(instr->UnlinkSrc2());
    }

    instr->m_opcode = Js::OpCode::Ld_A;

    InvalidateInductionVariables(instr);

    return true;
}